

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDebugRnglists.cpp
# Opt level: O0

DWARFAddressRangesVector * __thiscall
llvm::DWARFDebugRnglist::getAbsoluteRanges
          (DWARFAddressRangesVector *__return_storage_ptr__,DWARFDebugRnglist *this,
          Optional<llvm::object::SectionedAddress> BaseAddr,DWARFUnit *U)

{
  bool bVar1;
  SectionedAddress *pSVar2;
  SectionedAddress local_d0;
  undefined1 local_c0 [8];
  Optional<llvm::object::SectionedAddress> Start;
  DWARFAddressRange E;
  SectionedAddress local_80 [2];
  anon_union_16_2_fc7899a5_for_OptionalStorage<llvm::object::SectionedAddress,_true>_2 local_60;
  reference local_48;
  RangeListEntry *RLE;
  const_iterator __end1;
  const_iterator __begin1;
  ListEntries *__range1;
  DWARFUnit *U_local;
  DWARFDebugRnglist *this_local;
  DWARFAddressRangesVector *Res;
  
  std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::vector
            (__return_storage_ptr__);
  __end1 = std::vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>::begin
                     ((vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)this);
  RLE = (RangeListEntry *)
        std::vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>::end
                  ((vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_> *)this);
  while ((bVar1 = __gnu_cxx::operator!=
                            (&__end1,(__normal_iterator<const_llvm::RangeListEntry_*,_std::vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>_>
                                      *)&RLE), bVar1 &&
         (local_48 = __gnu_cxx::
                     __normal_iterator<const_llvm::RangeListEntry_*,_std::vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>_>
                     ::operator*(&__end1), (local_48->super_DWARFListEntryBase).EntryKind != '\0')))
  {
    if ((local_48->super_DWARFListEntryBase).EntryKind == '\x01') {
      DWARFUnit::getAddrOffsetSectionItem
                ((Optional<llvm::object::SectionedAddress> *)&local_60.value,U,
                 (uint32_t)local_48->Value0);
      BaseAddr.Storage.field_0.value.Address = local_60.value.Address;
      bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&BaseAddr);
      if (!bVar1) {
        local_80[0].Address = local_48->Value0;
        local_80[0].SectionIndex = 0xffffffffffffffff;
        Optional<llvm::object::SectionedAddress>::operator=(&BaseAddr,local_80);
      }
    }
    else if ((local_48->super_DWARFListEntryBase).EntryKind == '\x05') {
      E.SectionIndex = local_48->Value0;
      Optional<llvm::object::SectionedAddress>::operator=
                (&BaseAddr,(SectionedAddress *)&E.SectionIndex);
    }
    else {
      E.HighPC = (local_48->super_DWARFListEntryBase).SectionIndex;
      bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&BaseAddr);
      if ((bVar1) && (E.HighPC == 0xffffffffffffffff)) {
        pSVar2 = Optional<llvm::object::SectionedAddress>::operator->(&BaseAddr);
        E.HighPC = pSVar2->SectionIndex;
      }
      switch((local_48->super_DWARFListEntryBase).EntryKind) {
      case '\x03':
        DWARFUnit::getAddrOffsetSectionItem
                  ((Optional<llvm::object::SectionedAddress> *)local_c0,U,(uint32_t)local_48->Value0
                  );
        bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)local_c0);
        if (!bVar1) {
          local_d0.Address = 0;
          local_d0.SectionIndex = 0xffffffffffffffff;
          Optional<llvm::object::SectionedAddress>::operator=
                    ((Optional<llvm::object::SectionedAddress> *)local_c0,&local_d0);
        }
        pSVar2 = Optional<llvm::object::SectionedAddress>::operator->
                           ((Optional<llvm::object::SectionedAddress> *)local_c0);
        E.HighPC = pSVar2->SectionIndex;
        pSVar2 = Optional<llvm::object::SectionedAddress>::operator->
                           ((Optional<llvm::object::SectionedAddress> *)local_c0);
        Start.Storage._16_8_ = pSVar2->Address;
        E.LowPC = Start.Storage._16_8_ + local_48->Value1;
        break;
      case '\x04':
        Start.Storage._16_8_ = local_48->Value0;
        E.LowPC = local_48->Value1;
        bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)&BaseAddr);
        if (bVar1) {
          pSVar2 = Optional<llvm::object::SectionedAddress>::operator->(&BaseAddr);
          Start.Storage._16_8_ = Start.Storage._16_8_ + pSVar2->Address;
          pSVar2 = Optional<llvm::object::SectionedAddress>::operator->(&BaseAddr);
          E.LowPC = pSVar2->Address + E.LowPC;
        }
        break;
      default:
        llvm_unreachable_internal
                  ("Unsupported range list encoding",
                   "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/third_party/llvm-project/DWARFDebugRnglists.cpp"
                   ,0xa6);
      case '\x06':
        Start.Storage._16_8_ = local_48->Value0;
        E.LowPC = local_48->Value1;
        break;
      case '\a':
        Start.Storage._16_8_ = local_48->Value0;
        E.LowPC = Start.Storage._16_8_ + local_48->Value1;
      }
      std::vector<llvm::DWARFAddressRange,_std::allocator<llvm::DWARFAddressRange>_>::push_back
                (__return_storage_ptr__,(value_type *)&Start.Storage.hasVal);
    }
    __gnu_cxx::
    __normal_iterator<const_llvm::RangeListEntry_*,_std::vector<llvm::RangeListEntry,_std::allocator<llvm::RangeListEntry>_>_>
    ::operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

DWARFAddressRangesVector DWARFDebugRnglist::getAbsoluteRanges(
    llvm::Optional<object::SectionedAddress> BaseAddr, DWARFUnit &U) const {
  DWARFAddressRangesVector Res;
  for (const RangeListEntry &RLE : Entries) {
    if (RLE.EntryKind == dwarf::DW_RLE_end_of_list)
      break;
    if (RLE.EntryKind == dwarf::DW_RLE_base_addressx) {
      BaseAddr = U.getAddrOffsetSectionItem(RLE.Value0);
      if (!BaseAddr)
        BaseAddr = {RLE.Value0, -1ULL};
      continue;
    }
    if (RLE.EntryKind == dwarf::DW_RLE_base_address) {
      BaseAddr = {RLE.Value0, RLE.SectionIndex};
      continue;
    }

    DWARFAddressRange E;
    E.SectionIndex = RLE.SectionIndex;
    if (BaseAddr && E.SectionIndex == -1ULL)
      E.SectionIndex = BaseAddr->SectionIndex;

    switch (RLE.EntryKind) {
    case dwarf::DW_RLE_offset_pair:
      E.LowPC = RLE.Value0;
      E.HighPC = RLE.Value1;
      if (BaseAddr) {
        E.LowPC += BaseAddr->Address;
        E.HighPC += BaseAddr->Address;
      }
      break;
    case dwarf::DW_RLE_start_end:
      E.LowPC = RLE.Value0;
      E.HighPC = RLE.Value1;
      break;
    case dwarf::DW_RLE_start_length:
      E.LowPC = RLE.Value0;
      E.HighPC = E.LowPC + RLE.Value1;
      break;
    case dwarf::DW_RLE_startx_length: {
      auto Start = U.getAddrOffsetSectionItem(RLE.Value0);
      if (!Start)
        Start = {0, -1ULL};
      E.SectionIndex = Start->SectionIndex;
      E.LowPC = Start->Address;
      E.HighPC = E.LowPC + RLE.Value1;
      break;
    }
    default:
      // Unsupported encodings should have been reported during extraction,
      // so we should not run into any here.
      llvm_unreachable("Unsupported range list encoding");
    }
    Res.push_back(E);
  }
  return Res;
}